

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

string * __thiscall
spectest::JSONParser::CreateModulePath_abi_cxx11_
          (string *__return_storage_ptr__,JSONParser *this,string_view filename)

{
  size_type sVar1;
  string_view path_00;
  string local_c0;
  string local_a0;
  string local_80;
  undefined1 local_59;
  spectest *local_58;
  char *local_50;
  undefined1 local_48 [8];
  string_view dirname;
  string_view spec_json_filename;
  JSONParser *this_local;
  string_view filename_local;
  string *path;
  
  filename_local.data_ = (char *)filename.size_;
  path_00.size_ = (JSONParser *)filename.data_;
  local_58 = (spectest *)(this->loc_).filename.data_;
  local_50 = (char *)(this->loc_).filename.size_;
  path_00.data_ = local_50;
  dirname.size_ = (size_type)local_58;
  this_local = path_00.size_;
  filename_local.size_ = (size_type)__return_storage_ptr__;
  _local_48 = GetDirname(local_58,path_00);
  local_59 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = wabt::string_view::size((string_view *)local_48);
  if (sVar1 == 0) {
    wabt::string_view::to_string_abi_cxx11_(&local_80,(string_view *)&this_local);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    wabt::string_view::to_string_abi_cxx11_(&local_a0,(string_view *)local_48);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
    wabt::string_view::to_string_abi_cxx11_(&local_c0,(string_view *)&this_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  wabt::ConvertBackslashToSlash(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string JSONParser::CreateModulePath(string_view filename) {
  string_view spec_json_filename = loc_.filename;
  string_view dirname = GetDirname(spec_json_filename);
  std::string path;

  if (dirname.size() == 0) {
    path = filename.to_string();
  } else {
    path = dirname.to_string();
    path += '/';
    path += filename.to_string();
  }

  ConvertBackslashToSlash(&path);
  return path;
}